

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O2

Builder * __thiscall
capnproto_test::capnp::test::TestDefaults::Builder::getTextList
          (Builder *__return_storage_ptr__,Builder *this)

{
  PointerBuilder local_28;
  
  local_28.pointer = (this->_builder).pointers + 0xf;
  local_28.segment = (this->_builder).segment;
  local_28.capTable = (this->_builder).capTable;
  ::capnp::_::PointerBuilder::getList
            (&__return_storage_ptr__->builder,&local_28,POINTER,(word *)&DAT_0047df80);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::List< ::capnp::Text,  ::capnp::Kind::BLOB>::Builder TestDefaults::Builder::getTextList() {
  return ::capnp::_::PointerHelpers< ::capnp::List< ::capnp::Text,  ::capnp::Kind::BLOB>>::get(_builder.getPointerField(
      ::capnp::bounded<15>() * ::capnp::POINTERS),
        ::capnp::schemas::bp_eb3f9ebe98c73cb6 + 803);
}